

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O0

uint __thiscall
ThreeWiseHash<unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (ThreeWiseHash<unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  size_type sVar1;
  reference pvVar2;
  byte *pbVar3;
  ulong local_28;
  size_t k;
  uint answer;
  deque<unsigned_char,_std::allocator<unsigned_char>_> *c_local;
  ThreeWiseHash<unsigned_int,_unsigned_char> *this_local;
  
  k._4_4_ = 0;
  local_28 = 0;
  while( true ) {
    sVar1 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
    if (sVar1 <= local_28) break;
    pvVar2 = std::
             vector<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
             ::operator[]((vector<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
                           *)(this + 0x60),local_28);
    pbVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[](c,local_28);
    k._4_4_ = pvVar2->hashvalues[*pbVar3] ^ k._4_4_;
    local_28 = local_28 + 1;
  }
  return k._4_4_;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (size_t k = 0; k < c.size(); ++k) {
      answer ^= hashers[k].hashvalues[c[k]];
    }
    return answer;
  }